

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

tchar SkipWhite(TidyConfigImpl *config)

{
  Bool BVar1;
  tchar tVar2;
  bool bVar3;
  TidyConfigImpl *config_local;
  
  while( true ) {
    BVar1 = prvTidyIsWhite(config->c);
    bVar3 = false;
    if (BVar1 != no) {
      BVar1 = prvTidyIsNewline(config->c);
      bVar3 = BVar1 == no;
    }
    if (!bVar3) break;
    tVar2 = GetC(config);
    config->c = tVar2;
  }
  return config->c;
}

Assistant:

static tchar SkipWhite( TidyConfigImpl* config )
{
    while ( TY_(IsWhite)(config->c) && !TY_(IsNewline)(config->c) )
        config->c = GetC( config );
    return config->c;
}